

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9MemObjToInteger(jx9_value *pObj)

{
  uint uVar1;
  int iVar2;
  jx9_hashmap *pMap;
  anon_union_8_3_18420de5_for_x aVar3;
  jx9_real r;
  SyString local_20;
  
  uVar1 = pObj->iFlags;
  if ((uVar1 & 2) != 0) {
    return 0;
  }
  if ((uVar1 & 4) == 0) {
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 1) == 0) {
        if ((uVar1 & 0x20) == 0) {
          if ((uVar1 & 0x40) != 0) {
            pMap = (jx9_hashmap *)(pObj->x).iVal;
            aVar3.iVal._4_4_ = 0;
            aVar3.iVal._0_4_ = pMap->nEntry;
            iVar2 = pMap->iRef;
            pMap->iRef = iVar2 + -1;
            if (iVar2 < 2) {
              jx9HashmapRelease(pMap,1);
            }
            goto LAB_0011ad19;
          }
          if ((uVar1 >> 8 & 1) != 0) {
            aVar3.iVal._1_7_ = 0;
            aVar3.iVal._0_1_ = (pObj->x).iVal != 0;
            goto LAB_0011ad19;
          }
        }
        aVar3.rVal = 0.0;
      }
      else {
        local_20.zString = (char *)(pObj->sBlob).pBlob;
        local_20.nByte = (pObj->sBlob).nByte;
        aVar3.iVal = jx9TokenValueToInt64(&local_20);
      }
    }
    else {
      aVar3 = pObj->x;
    }
  }
  else {
    aVar3.rVal = -0.0;
    if (ABS((pObj->x).rVal) <= 9.223372036854776e+18) {
      aVar3.iVal = (long)(pObj->x).rVal;
    }
  }
LAB_0011ad19:
  (pObj->x).rVal = (jx9_real)aVar3;
  SyBlobRelease(&pObj->sBlob);
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToInteger(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_INT) == 0 ){
		/* Preform the conversion */
		pObj->x.iVal = MemObjIntValue(&(*pObj));
		/* Invalidate any prior representations */
		SyBlobRelease(&pObj->sBlob);
		MemObjSetType(pObj, MEMOBJ_INT);
	}
	return SXRET_OK;
}